

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall
QWidgetTextControlPrivate::sendMouseEventToInputContext
          (QWidgetTextControlPrivate *this,QEvent *e,Type eventType,MouseButton button,QPointF *pos,
          KeyboardModifiers modifiers,MouseButtons buttons,QPoint *globalPos)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Action AVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QArrayData *local_50;
  ulong local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&this->field_0x8;
  bVar3 = isPreediting(this);
  if (bVar3) {
    QTextCursor::block();
    QTextBlock::layout();
    iVar4 = (**(code **)(*plVar2 + 0x78))(plVar2,pos,1);
    iVar5 = QTextCursor::position();
    uVar7 = iVar4 - iVar5;
    if ((int)uVar7 < 0) {
      bVar3 = true;
    }
    else {
      QTextLayout::preeditAreaText();
      bVar3 = local_40 < uVar7;
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
    }
    if (bVar3) {
      uVar7 = 0xffffffff;
    }
    if (-1 < (int)uVar7) {
      if (eventType == MouseButtonRelease) {
        AVar6 = QGuiApplication::inputMethod();
        QInputMethod::invokeAction(AVar6,0);
      }
      (**(code **)(*(long *)e + 0x10))(e,1);
      bVar3 = true;
      goto LAB_004cc9b6;
    }
  }
  bVar3 = false;
LAB_004cc9b6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QWidgetTextControlPrivate::sendMouseEventToInputContext(
        QEvent *e, QEvent::Type eventType, Qt::MouseButton button, const QPointF &pos,
        Qt::KeyboardModifiers modifiers, Qt::MouseButtons buttons, const QPoint &globalPos)
{
    Q_UNUSED(eventType);
    Q_UNUSED(button);
    Q_UNUSED(pos);
    Q_UNUSED(modifiers);
    Q_UNUSED(buttons);
    Q_UNUSED(globalPos);
#if !defined(QT_NO_IM)
    Q_Q(QWidgetTextControl);

    if (isPreediting()) {
        QTextLayout *layout = cursor.block().layout();
        int cursorPos = q->hitTest(pos, Qt::FuzzyHit) - cursor.position();

        if (cursorPos < 0 || cursorPos > layout->preeditAreaText().size())
            cursorPos = -1;

        if (cursorPos >= 0) {
            if (eventType == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, cursorPos);

            e->setAccepted(true);
            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif
    return false;
}